

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O0

void gutil::trim(string *s)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  string *in_RDI;
  bool bVar5;
  size_t pos;
  string local_50 [32];
  string local_30 [32];
  ulong local_10;
  string *local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  while( true ) {
    uVar1 = local_10;
    uVar3 = std::__cxx11::string::size();
    bVar5 = false;
    if (uVar1 < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_8);
      iVar2 = isspace((int)*pcVar4);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    local_10 = local_10 + 1;
  }
  if (local_10 != 0) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)local_8);
    std::__cxx11::string::operator=(local_8,local_30);
    std::__cxx11::string::~string(local_30);
  }
  local_10 = std::__cxx11::string::size();
  while( true ) {
    bVar5 = false;
    if (local_10 != 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_8);
      iVar2 = isspace((int)*pcVar4);
      bVar5 = iVar2 != 0;
    }
    uVar1 = local_10;
    if (!bVar5) break;
    local_10 = local_10 - 1;
  }
  uVar3 = std::__cxx11::string::size();
  if (uVar1 < uVar3) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_8);
    std::__cxx11::string::operator=(local_8,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void gutil::trim(std::string &s)
{
  size_t pos;

  pos=0;

  while (pos < s.size() && isspace(s[pos]))
  {
    pos++;
  }

  if (pos > 0)
  {
    s=s.substr(pos);
  }

  pos=s.size();

  while (pos > 0 && isspace(s[pos-1]))
  {
    pos--;
  }

  if (pos < s.size())
  {
    s=s.substr(0, pos);
  }
}